

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall Liby::http::HttpServer::handleAcceptEvent(HttpServer *this,Connection *conn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BaseContext *__tmp;
  _Sp_counted_ptr_inplace<HttpContext,_std::allocator<HttpContext>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  undefined1 local_11;
  
  p_Var1 = (_Sp_counted_ptr_inplace<HttpContext,_std::allocator<HttpContext>,_(__gnu_cxx::_Lock_policy)2>
            *)operator_new(0xd0);
  std::_Sp_counted_ptr_inplace<HttpContext,_std::allocator<HttpContext>,_(__gnu_cxx::_Lock_policy)2>
  ::_Sp_counted_ptr_inplace<>(p_Var1,&local_11);
  (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  this_00 = (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void HttpServer::handleAcceptEvent(Connection &conn) {
    conn.context_ = std::make_shared<HttpContext>();
}